

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O1

qreal __thiscall QLineF::angleTo(QLineF *this,QLineF *l)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  qreal qVar4;
  qreal qVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  bVar1 = qFuzzyCompare(&this->pt1,&this->pt2);
  qVar4 = 0.0;
  if (!bVar1) {
    bVar1 = qFuzzyCompare(&l->pt1,&l->pt2);
    if (bVar1) {
      qVar4 = 0.0;
    }
    else {
      qVar4 = angle(this);
      qVar5 = angle(l);
      dVar6 = qVar5 - qVar4;
      dVar7 = dVar6 + -360.0;
      uVar2 = -(ulong)(dVar7 < -dVar7);
      uVar3 = -(ulong)(dVar6 < -dVar6);
      dVar8 = (double)(~uVar3 & (ulong)dVar6 | (ulong)-dVar6 & uVar3);
      if (360.0 <= dVar8) {
        dVar8 = 360.0;
      }
      qVar4 = 0.0;
      if (dVar8 < (double)(~uVar2 & (ulong)dVar7 | (ulong)-dVar7 & uVar2) * 1000000000000.0) {
        qVar4 = (qreal)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar6 |
                       (ulong)(dVar6 + 360.0) & -(ulong)(dVar6 < 0.0));
      }
    }
  }
  return qVar4;
}

Assistant:

qreal QLineF::angleTo(const QLineF &l) const
{
    if (isNull() || l.isNull())
        return 0;

    const qreal a1 = angle();
    const qreal a2 = l.angle();

    const qreal delta = a2 - a1;
    const qreal delta_normalized = delta < 0 ? delta + 360 : delta;

    if (qFuzzyCompare(delta, qreal(360)))
        return 0;
    else
        return delta_normalized;
}